

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

RgbaChannels Imf_2_5::anon_unknown_22::rgbaChannels(ChannelList *ch,string *channelNamePrefix)

{
  RgbaChannels RVar1;
  Channel *pCVar2;
  Channel *pCVar3;
  Channel *pCVar4;
  Channel *pCVar5;
  RgbaChannels RVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  Channel *local_38;
  
  std::operator+(&bStack_58,channelNamePrefix,"R");
  pCVar2 = ChannelList::findChannel(ch,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::operator+(&bStack_58,channelNamePrefix,"G");
  local_38 = ChannelList::findChannel(ch,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::operator+(&bStack_58,channelNamePrefix,"B");
  pCVar3 = ChannelList::findChannel(ch,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::operator+(&bStack_58,channelNamePrefix,"A");
  pCVar4 = ChannelList::findChannel(ch,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::operator+(&bStack_58,channelNamePrefix,"Y");
  pCVar5 = ChannelList::findChannel(ch,&bStack_58);
  RVar6 = (pCVar2 != (Channel *)0x0) + WRITE_G;
  if (local_38 == (Channel *)0x0) {
    RVar6 = (uint)(pCVar2 != (Channel *)0x0);
  }
  RVar1 = RVar6 + WRITE_B;
  if (pCVar3 == (Channel *)0x0) {
    RVar1 = RVar6;
  }
  RVar6 = RVar1 + WRITE_A;
  if (pCVar4 == (Channel *)0x0) {
    RVar6 = RVar1;
  }
  std::__cxx11::string::~string((string *)&bStack_58);
  RVar1 = RVar6 | WRITE_Y;
  if (pCVar5 == (Channel *)0x0) {
    RVar1 = RVar6;
  }
  return RVar1;
}

Assistant:

RgbaChannels
rgbaChannels (const ChannelList &ch, const string &channelNamePrefix = "")
{
    int i = 0;

    if (ch.findChannel (channelNamePrefix + "R"))
	i |= WRITE_R;

    if (ch.findChannel (channelNamePrefix + "G"))
	i |= WRITE_G;
    
    if (ch.findChannel (channelNamePrefix + "B"))
	i |= WRITE_B;

    if (ch.findChannel (channelNamePrefix + "A"))
	i |= WRITE_A;

    if (ch.findChannel (channelNamePrefix + "Y"))
	i |= WRITE_Y;

    return RgbaChannels (i);
}